

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_footprints.cpp
# Opt level: O3

double __thiscall cp::PlanFootprints::isCollisionLegs(PlanFootprints *this,double yn,double yb)

{
  if (yn < 0.0 && *(int *)(this + 0x2e0) == 0) {
    return (double)(~-(ulong)(0.0 < yb) & (ulong)yn);
  }
  if (0.0 <= yn && *(int *)(this + 0x2e0) == 1) {
    yb = (double)(~-(ulong)(yb < 0.0) & (ulong)yn);
  }
  return yb;
}

Assistant:

double PlanFootprints::isCollisionLegs(double yn, double yb) {
  if (swingleg == right && yn < 0) {
    if (yb > 0) return 0.0;
    else return yn;
  } else if (swingleg == left && yn >= 0) {
    if (yb < 0) return 0.0;
    else return yn;
  } else {
    return yb;
  }
}